

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_dec
          (int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  ulong uVar1;
  ulong uVar2;
  basic_format_specs<wchar_t> *pbVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  format_specs local_c8;
  ulong local_a8;
  ulong uStack_a0;
  wchar_t local_98 [4];
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::dec_writer>
  local_88;
  
  uVar1 = (ulong)this->abs_value;
  uVar2 = *(ulong *)((long)&this->abs_value + 8);
  auVar8 = (undefined1  [16])this->abs_value;
  uVar6 = 1;
  if ((uVar1 < 10) <= uVar2) {
    uVar4 = 4;
    do {
      uVar6 = uVar4;
      uVar7 = auVar8._8_8_;
      uVar5 = auVar8._0_8_;
      if (uVar7 == 0 && (ulong)(99 < uVar5) <= -uVar7) {
        uVar6 = uVar6 - 2;
        goto LAB_0017c610;
      }
      if (uVar7 == 0 && (ulong)(999 < uVar5) <= -uVar7) {
        uVar6 = uVar6 - 1;
        goto LAB_0017c610;
      }
      if (uVar7 < (uVar5 < 10000)) goto LAB_0017c610;
      auVar8 = __udivti3(uVar5,uVar7,10000,0);
      uVar4 = uVar6 + 4;
    } while (uVar7 != 0 || -uVar7 < (ulong)(99999 < uVar5));
    uVar6 = uVar6 + 1;
  }
LAB_0017c610:
  pbVar3 = this->specs;
  local_88.prefix.size_ = (size_t)this->prefix_size;
  local_c8.width = pbVar3->width;
  local_c8.precision = pbVar3->precision;
  uStack_a0._0_1_ = pbVar3->type;
  uStack_a0._1_3_ = *(undefined3 *)&pbVar3->field_0x9;
  uStack_a0._4_4_ = (pbVar3->fill).data_[0];
  local_c8.fill.data_._4_8_ = *(undefined8 *)((pbVar3->fill).data_ + 1);
  local_c8.fill._12_8_ = *(undefined8 *)((pbVar3->fill).data_ + 3);
  uVar5 = uVar6 + local_88.prefix.size_;
  local_c8._9_1_ = SUB31(uStack_a0._1_3_,0);
  local_88.size_ = uVar5;
  local_88.fill = uStack_a0._4_4_;
  if ((local_c8._9_1_ & 0xf) == 4) {
    uVar7 = local_c8._0_8_ & 0xffffffff;
    local_88.padding = 0;
    if (uVar5 <= uVar7) {
      local_88.size_ = uVar7;
      local_88.padding = uVar7 - uVar5;
    }
  }
  else if ((int)uVar6 < (int)local_c8.precision) {
    local_88.size_ = (uint)local_c8.precision + local_88.prefix.size_;
    local_88.padding = (ulong)(local_c8.precision - uVar6);
    local_88.fill = L'0';
  }
  else {
    local_88.padding = 0;
  }
  local_c8._8_8_ = uStack_a0;
  if ((uStack_a0 & 0xf00) == 0) {
    local_c8._8_8_ = uStack_a0 | 0x200;
  }
  local_88.prefix.data_ = this->prefix;
  local_a8 = local_c8._0_8_;
  local_98._0_8_ = local_c8.fill.data_._4_8_;
  local_98._8_8_ = local_c8.fill._12_8_;
  local_88.f.abs_value._0_8_ = uVar1;
  local_88.f.abs_value._8_8_ = uVar2;
  local_88.f.num_digits = uVar6;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::dec_writer>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_c8,&local_88);
  return;
}

Assistant:

void on_dec() {
      int num_digits = count_digits(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       dec_writer{abs_value, num_digits});
    }